

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O0

void olsrv2_lan_remove(nhdp_domain *domain,os_route_key *prefix)

{
  avl_tree *paVar1;
  long lVar2;
  char *local_60;
  int local_54;
  int i;
  olsrv2_lan_domaindata *lan_data;
  olsrv2_lan_entry *entry;
  os_route_key *prefix_local;
  nhdp_domain *domain_local;
  
  paVar1 = olsrv2_lan_get_tree();
  lVar2 = avl_find(paVar1,prefix);
  if (lVar2 == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = (char *)(lVar2 + -0x28);
  }
  if (local_60 != (char *)0x0) {
    local_60[(long)domain->index * 8 + 0x69] = '\0';
    olsrv2_routing_domain_changed(domain,true);
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      if ((local_60[(long)local_54 * 8 + 0x69] & 1U) != 0) {
        return;
      }
    }
    _remove(local_60);
  }
  return;
}

Assistant:

void
olsrv2_lan_remove(struct nhdp_domain *domain, const struct os_route_key *prefix) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (!entry) {
    return;
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->active = false;
  olsrv2_routing_domain_changed(domain, true);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    if (entry->_domaindata[i].active) {
      /* entry is still in use */
      return;
    }
  }
  _remove(entry);
}